

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_tests.cpp
# Opt level: O0

void logging_tests::ResetLogger(void)

{
  long lVar1;
  long in_FS_OFFSET;
  Logger *in_stack_ffffffffffffff88;
  unordered_map<BCLog::LogFlags,_BCLog::Level,_std::hash<BCLog::LogFlags>,_std::equal_to<BCLog::LogFlags>,_std::allocator<std::pair<const_BCLog::LogFlags,_BCLog::Level>_>_>
  *in_stack_ffffffffffffffa8;
  Logger *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  LogInstance();
  BCLog::Logger::SetLogLevel(in_stack_ffffffffffffff88,Trace);
  LogInstance();
  std::
  unordered_map<BCLog::LogFlags,_BCLog::Level,_std::hash<BCLog::LogFlags>,_std::equal_to<BCLog::LogFlags>,_std::allocator<std::pair<const_BCLog::LogFlags,_BCLog::Level>_>_>
  ::unordered_map((unordered_map<BCLog::LogFlags,_BCLog::Level,_std::hash<BCLog::LogFlags>,_std::equal_to<BCLog::LogFlags>,_std::allocator<std::pair<const_BCLog::LogFlags,_BCLog::Level>_>_>
                   *)in_stack_ffffffffffffff88);
  BCLog::Logger::SetCategoryLogLevel(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::
  unordered_map<BCLog::LogFlags,_BCLog::Level,_std::hash<BCLog::LogFlags>,_std::equal_to<BCLog::LogFlags>,_std::allocator<std::pair<const_BCLog::LogFlags,_BCLog::Level>_>_>
  ::~unordered_map((unordered_map<BCLog::LogFlags,_BCLog::Level,_std::hash<BCLog::LogFlags>,_std::equal_to<BCLog::LogFlags>,_std::allocator<std::pair<const_BCLog::LogFlags,_BCLog::Level>_>_>
                    *)in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void ResetLogger()
{
    LogInstance().SetLogLevel(BCLog::DEFAULT_LOG_LEVEL);
    LogInstance().SetCategoryLogLevel({});
}